

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O2

void * lj_mem_realloc(lua_State *L,void *p,GCSize osz,GCSize nsz)

{
  void *pvVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(L->glref).ptr32;
  *(int *)(uVar2 + 0x18c) = (int)L;
  pvVar1 = (void *)(**(code **)(uVar2 + 0x40))
                             (*(undefined8 *)(uVar2 + 0x48),p,(ulong)osz,(ulong)nsz);
  if ((nsz != 0) && (pvVar1 == (void *)0x0)) {
    lj_err_mem(L);
  }
  *(int *)(uVar2 + 0x50) = *(int *)(uVar2 + 0x50) + (nsz - osz);
  *(long *)(uVar2 + 0x98) = *(long *)(uVar2 + 0x98) + (ulong)nsz;
  *(long *)(uVar2 + 0x90) = *(long *)(uVar2 + 0x90) + (ulong)osz;
  return pvVar1;
}

Assistant:

void *lj_mem_realloc(lua_State *L, void *p, GCSize osz, GCSize nsz)
{
  global_State *g = G(L);
  lj_assertG((osz == 0) == (p == NULL), "realloc API violation");

  setgcref(g->mem_L, obj2gco(L));
  p = g->allocf(g->allocd, p, osz, nsz);
  if (p == NULL && nsz > 0)
    lj_err_mem(L);
  lj_assertG((nsz == 0) == (p == NULL), "allocf API violation");
  lj_assertG(checkptrGC(p),
	     "allocated memory address %p outside required range", p);
  g->gc.total = (g->gc.total - osz) + nsz;
  g->gc.allocated += nsz;
  g->gc.freed += osz;
  return p;
}